

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O1

string * google::protobuf::compiler::cpp::Formatter::Payload<google::protobuf::OneofDescriptor>
                   (string *__return_storage_ptr__,OneofDescriptor *descriptor)

{
  int iVar1;
  pointer piVar2;
  int iVar3;
  int *piVar4;
  undefined8 *puVar5;
  int tmp;
  ulong uVar6;
  pointer piVar7;
  vector<int,_std::allocator<int>_> path;
  Annotation annotation;
  vector<int,_std::allocator<int>_> local_88;
  GeneratedCodeInfo_Annotation local_70;
  
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  OneofDescriptor::GetLocationPath(descriptor,&local_88);
  GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation(&local_70,(Arena *)0x0,false);
  piVar2 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar7 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      iVar3 = local_70.path_.current_size_;
      iVar1 = *piVar7;
      uVar6 = (ulong)(uint)local_70.path_.current_size_;
      if (local_70.path_.current_size_ == local_70.path_.total_size_) {
        RepeatedField<int>::Reserve(&local_70.path_,local_70.path_.total_size_ + 1);
      }
      piVar4 = RepeatedField<int>::elements(&local_70.path_);
      piVar4[uVar6] = iVar1;
      local_70.path_.current_size_ = iVar3 + 1;
      piVar7 = piVar7 + 1;
    } while (piVar7 != piVar2);
  }
  local_70._has_bits_.has_bits_[0] = (uint32_t  [1])((uint)local_70._has_bits_.has_bits_[0] | 1);
  puVar5 = (undefined8 *)
           (local_70.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
  if ((local_70.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  internal::ArenaStringPtr::Set
            (&local_70.source_file_,**(undefined8 **)(*(long *)(descriptor + 0x10) + 0x10),puVar5);
  MessageLite::SerializeAsString_abi_cxx11_(__return_storage_ptr__,(MessageLite *)&local_70);
  GeneratedCodeInfo_Annotation::~GeneratedCodeInfo_Annotation(&local_70);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Payload(const Descriptor* descriptor) {
    std::vector<int> path;
    descriptor->GetLocationPath(&path);
    GeneratedCodeInfo::Annotation annotation;
    for (int index : path) {
      annotation.add_path(index);
    }
    annotation.set_source_file(descriptor->file()->name());
    return annotation.SerializeAsString();
  }